

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O0

void __thiscall cfd::CoinSelectionOption::CoinSelectionOption(CoinSelectionOption *this)

{
  undefined1 *in_RDI;
  
  *in_RDI = 1;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 20000;
  *(undefined8 *)(in_RDI + 0x18) = 20000;
  *(undefined8 *)(in_RDI + 0x20) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x28) = 3000;
  in_RDI[0x30] = 0;
  core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)(in_RDI + 0x38));
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)(in_RDI + 100) = 0x34;
  return;
}

Assistant:

CoinSelectionOption::CoinSelectionOption()
    : effective_fee_baserate_(kDefaultLongTermFeeRate),
      long_term_fee_baserate_(kDefaultLongTermFeeRate),
      knapsack_minimum_change_(-1),
      dust_fee_rate_(kDustRelayTxFeeRate),
      has_ignore_fee_asset_(false) {
  // do nothing
}